

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

DDLNode * ODDLParser::createDDLNode(Text *id,OpenDDLParser *parser)

{
  char *__s;
  allocator<char> local_89;
  string local_88;
  DDLNode *local_68;
  DDLNode *node;
  DDLNode *parent;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string type;
  OpenDDLParser *parser_local;
  Text *id_local;
  
  if ((id == (Text *)0x0) || (parser == (OpenDDLParser *)0x0)) {
    id_local = (Text *)0x0;
  }
  else if (id->m_buffer == (char *)0x0) {
    id_local = (Text *)0x0;
  }
  else {
    __s = id->m_buffer;
    type.field_2._8_8_ = parser;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,__s,&local_41);
    std::allocator<char>::~allocator(&local_41);
    node = OpenDDLParser::top((OpenDDLParser *)type.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
    id_local = (Text *)DDLNode::create((string *)local_40,&local_88,node);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    local_68 = (DDLNode *)id_local;
    std::__cxx11::string::~string((string *)local_40);
  }
  return (DDLNode *)id_local;
}

Assistant:

static DDLNode *createDDLNode( Text *id, OpenDDLParser *parser ) {
    // Basic checks
    if( ddl_nullptr == id || ddl_nullptr == parser ) {
        return ddl_nullptr;
    }
    
    // If the buffer is empty ( an empty node ) return nullptr
    if ( ddl_nullptr == id->m_buffer ) {
        return ddl_nullptr;
    }

    const std::string type( id->m_buffer );
    DDLNode *parent( parser->top() );
    DDLNode *node = DDLNode::create( type, "", parent );
    
    return node;
}